

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmHeadToLinkInterfaceMap * __thiscall
cmGeneratorTarget::GetHeadToLinkInterfaceUsageRequirementsMap
          (cmGeneratorTarget *this,string *config)

{
  mapped_type *pmVar1;
  string local_30;
  
  cmsys::SystemTools::UpperCase(&local_30,config);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmHeadToLinkInterfaceMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmHeadToLinkInterfaceMap>_>_>
           ::operator[](&this->LinkInterfaceUsageRequirementsOnlyMap,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pmVar1;
}

Assistant:

cmHeadToLinkInterfaceMap&
cmGeneratorTarget::GetHeadToLinkInterfaceUsageRequirementsMap(
  const std::string& config) const
{
  return this
    ->LinkInterfaceUsageRequirementsOnlyMap[cmSystemTools::UpperCase(config)];
}